

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O1

void __thiscall
boost::
const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
::init_from_extent_gen
          (const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
           *this,extent_gen<2UL> *ranges)

{
  pair<long,_long> pVar1;
  extent_range<long,_unsigned_long> eVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  index_list *piVar5;
  long lVar6;
  extent_list extents;
  undefined1 local_18 [16];
  
  piVar5 = &this->index_base_list_;
  lVar6 = 0;
  do {
    piVar5->elems[0] =
         *(long *)((long)&(ranges->ranges_).elems[0].super_pair<long,_long>.first + lVar6);
    lVar6 = lVar6 + 0x10;
    piVar5 = (index_list *)(piVar5->elems + 1);
  } while (lVar6 != 0x20);
  pVar1 = (ranges->ranges_).elems[0].super_pair<long,_long>;
  eVar2.super_pair<long,_long> = (ranges->ranges_).elems[1].super_pair<long,_long>;
  auVar4 = vpunpcklqdq_avx((undefined1  [16])pVar1,(undefined1  [16])eVar2.super_pair<long,_long>);
  auVar3 = vpunpckhqdq_avx((undefined1  [16])pVar1,(undefined1  [16])eVar2.super_pair<long,_long>);
  local_18 = vpsubq_avx(auVar3,auVar4);
  const_multi_array_ref<std::vector<AlphaVector,std::allocator<AlphaVector>>,2ul,std::vector<AlphaVector,std::allocator<AlphaVector>>*>
  ::init_multi_array_ref<long*>
            ((const_multi_array_ref<std::vector<AlphaVector,std::allocator<AlphaVector>>,2ul,std::vector<AlphaVector,std::allocator<AlphaVector>>*>
              *)this,(long *)local_18);
  return;
}

Assistant:

void init_from_extent_gen(const
                        detail::multi_array::
                        extent_gen<NumDims>& ranges) { 
    
    typedef boost::array<index,NumDims> extent_list;

    // get the index_base values
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              index_base_list_.begin(),
              boost::mem_fun_ref(&extent_range::start));

    // calculate the extents
    extent_list extents;
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              extents.begin(),
              boost::mem_fun_ref(&extent_range::size));

    init_multi_array_ref(extents.begin());
  }